

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

Rational * soplex::ratFromString(char *desc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char *in_RSI;
  Rational *in_RDI;
  size_t i;
  string den;
  size_t exp;
  size_t pos;
  int exponentidx;
  int mult;
  const_iterator it;
  string s;
  Rational *res;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffb18;
  undefined2 in_stack_fffffffffffffb20;
  undefined6 in_stack_fffffffffffffb22;
  double *in_stack_fffffffffffffb30;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  longdouble in_stack_fffffffffffffbd0;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffbe8;
  double local_3d8 [8];
  string local_398 [32];
  undefined1 local_378 [64];
  undefined7 in_stack_fffffffffffffcc8;
  byte in_stack_fffffffffffffccf;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffcd0;
  string local_310 [32];
  ulong local_2f0;
  allocator local_2e1;
  string local_2e0 [32];
  ulong local_2c0;
  ulong local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  undefined8 local_270;
  undefined4 local_264;
  undefined8 local_260;
  int local_258;
  allocator local_251;
  string local_250 [32];
  char *local_230;
  undefined1 local_228 [72];
  char *local_1e0;
  undefined1 local_1d8 [71];
  allocator local_191;
  string local_190 [32];
  undefined8 local_170 [3];
  undefined8 local_158;
  undefined1 local_149;
  char *local_148 [3];
  double *local_130;
  undefined1 *local_120;
  undefined1 *local_110;
  undefined1 *local_100;
  undefined8 *local_f0;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_c8;
  undefined8 local_b0;
  char **local_a8;
  undefined1 *local_a0;
  undefined8 local_88;
  char **local_80;
  undefined1 *local_78;
  undefined8 local_60;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_38;
  string *local_30;
  double *local_28;
  char **local_20;
  char **local_18;
  string *local_10;
  string *local_8;
  
  local_149 = 0;
  local_148[0] = in_RSI;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1c32c7);
  iVar2 = strcmp(local_148[0],"inf");
  if (iVar2 == 0) {
    local_158 = 0x54b249ad2594c37d;
    local_d8 = &local_158;
    local_c8 = local_d8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbd0);
  }
  else {
    iVar2 = strcmp(local_148[0],"-inf");
    pcVar4 = local_148[0];
    if (iVar2 == 0) {
      local_170[0] = 0xd4b249ad2594c37d;
      local_f0 = local_170;
      local_e0 = local_f0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbd0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,pcVar4,&local_191);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      lVar3 = std::__cxx11::string::find_first_of((char *)local_190,0x7e78a5);
      if (lVar3 == -1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
        if (*pcVar4 == '+') {
          local_1e0 = local_148[0] + 1;
          local_a0 = local_1d8;
          local_a8 = &local_1e0;
          local_b0 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)0x1c34e0);
          local_18 = local_a8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=(in_stack_fffffffffffffcd0,
                      (char *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
          local_100 = local_1d8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                      in_stack_fffffffffffffb18);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1c3594);
        }
        else {
          local_78 = local_228;
          local_80 = local_148;
          local_88 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)0x1c3679);
          local_20 = local_80;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=(in_stack_fffffffffffffcd0,
                      (char *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
          local_110 = local_228;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                      in_stack_fffffffffffffb18);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1c372d);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_250,"e",&local_251);
        local_230 = (char *)findSubStringIC(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        local_258 = 0;
        local_260 = std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffb18);
        if (bVar1) {
          local_270 = std::__cxx11::string::begin();
          lVar3 = __gnu_cxx::operator-
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffb18);
          local_264 = (undefined4)lVar3;
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_290,(ulong)local_190);
          local_258 = std::__cxx11::stoi((string *)
                                         CONCAT62(in_stack_fffffffffffffb22,
                                                  in_stack_fffffffffffffb20),
                                         (size_t *)in_stack_fffffffffffffb18,0);
          std::__cxx11::string::~string(local_290);
          std::__cxx11::string::substr((ulong)local_2b0,(ulong)local_190);
          std::__cxx11::string::operator=(local_190,local_2b0);
          std::__cxx11::string::~string(local_2b0);
        }
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
        if (*pcVar4 == '.') {
          std::__cxx11::string::insert((ulong)local_190,(char *)0x0);
        }
        local_2b8 = std::__cxx11::string::find((char)local_190,0x2e);
        if (local_2b8 != 0xffffffffffffffff) {
          lVar3 = std::__cxx11::string::length();
          local_2c0 = ~local_2b8 + lVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"1",&local_2e1);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          for (local_2f0 = 0; local_2f0 < local_2c0; local_2f0 = local_2f0 + 1) {
            std::__cxx11::string::append((char *)local_2e0);
          }
          std::__cxx11::string::erase((ulong)local_190,local_2b8);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
          if (*pcVar4 == '-') {
            in_stack_fffffffffffffccf = 0;
            std::__cxx11::string::substr((ulong)local_310,(ulong)local_190);
            uVar5 = std::__cxx11::string::find_first_not_of((char)local_310,0x30);
            lVar3 = std::__cxx11::string::size();
            if (uVar5 < lVar3 - 1U) {
              std::__cxx11::string::substr((ulong)&stack0xfffffffffffffcd0,(ulong)local_190);
              in_stack_fffffffffffffccf = 1;
              std::__cxx11::string::find_first_not_of((char)&stack0xfffffffffffffcd0,0x30);
            }
            else {
              std::__cxx11::string::size();
            }
            std::__cxx11::string::erase((ulong)local_190,1);
            if ((in_stack_fffffffffffffccf & 1) != 0) {
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd0);
            }
            std::__cxx11::string::~string(local_310);
          }
          else {
            uVar5 = std::__cxx11::string::find_first_not_of((char)local_190,0x30);
            lVar3 = std::__cxx11::string::size();
            if (uVar5 < lVar3 - 1U) {
              std::__cxx11::string::find_first_not_of((char)local_190,0x30);
            }
            else {
              std::__cxx11::string::size();
            }
            std::__cxx11::string::erase((ulong)local_190,0);
          }
          std::__cxx11::string::append((char *)local_190);
          std::__cxx11::string::append(local_190);
          std::__cxx11::string::~string(local_2e0);
        }
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_190);
        if (*pcVar4 == '+') {
          std::__cxx11::string::substr((ulong)local_398,(ulong)local_190);
          local_50 = local_378;
          local_58 = local_398;
          local_60 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)0x1c3daa);
          local_8 = local_58;
          std::__cxx11::string::c_str();
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=(in_stack_fffffffffffffcd0,
                      (char *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
          local_120 = local_378;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                      in_stack_fffffffffffffb18);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1c3e54);
          std::__cxx11::string::~string(local_398);
        }
        else {
          in_stack_fffffffffffffb30 = local_3d8;
          local_30 = local_190;
          local_38 = 0;
          local_28 = in_stack_fffffffffffffb30;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)0x1c3ede);
          local_10 = local_30;
          std::__cxx11::string::c_str();
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=(in_stack_fffffffffffffcd0,
                      (char *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
          local_130 = local_3d8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT62(in_stack_fffffffffffffb22,in_stack_fffffffffffffb20),
                      in_stack_fffffffffffffb18);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1c3f91);
        }
        std::pow<int,int>(0,0x1c3fa2);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      }
      std::__cxx11::string::~string(local_190);
    }
  }
  return in_RDI;
}

Assistant:

inline Rational ratFromString(const char* desc)
{
   Rational res;

   if(0 == strcmp(desc, "inf"))
   {
      res = 1e100;
   }
   else if(0 == strcmp(desc, "-inf"))
   {
      res = -1e100;
   }
   else
   {
      std::string s(desc);

      /* case 1: string is given in nom/den format */
      if(s.find_first_of(".Ee") == std::string::npos)
      {
         if(s[0] == '+')
            res = Rational(desc + 1);
         else
            res = Rational(desc);
      }
      /* case 2: string is given as base-10 decimal number */
      else
      {
         std::string::const_iterator it = findSubStringIC("e", s);
         int mult = 0;

         if(it != s.end())
         {
            int exponentidx = int(it - s.begin());
            mult = std::stoi(s.substr(exponentidx + 1, s.length()));
            s = s.substr(0, exponentidx);
         }

         // std::cout << s << std::endl;
         if(s[0] == '.')
            s.insert(0, "0");

         size_t pos = s.find('.');

         // if s contains a ., convert it to a rational
         if(pos != std::string::npos)
         {
            size_t exp = s.length() - 1 - pos;
            std::string den("1");

            for(size_t i = 0; i < exp; ++i)
               den.append("0");

            s.erase(pos, 1);
            assert(std::all_of(s.begin() + 1, s.end(), ::isdigit));

            // remove padding 0s
            if(s[0] == '-')
               s.erase(1, SOPLEX_MIN(s.substr(1).find_first_not_of('0'), s.size() - 1));
            else
               s.erase(0, SOPLEX_MIN(s.find_first_not_of('0'), s.size() - 1));

            s.append("/");
            s.append(den);
         }

         if(s[0] == '+')
            res = Rational(s.substr(1));
         else
            res = Rational(s);

         res *= pow(10, mult);
      }
   }

   return res;
}